

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O2

void Assimp::IFC::ProcessParametrizedProfile
               (IfcParameterizedProfileDef *def,TempMesh *meshout,ConversionData *conv)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  IfcRectangleProfileDef *pIVar6;
  IfcCircleProfileDef *pIVar7;
  IfcIShapeProfileDef *pIVar8;
  IfcAxis2Placement2D *in;
  Object *this;
  ulong __n;
  bool bVar9;
  float fVar10;
  undefined4 uVar11;
  uint uVar12;
  double dStack_220;
  double local_218;
  undefined8 uStack_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  IfcMatrix4 trafo;
  
  pIVar6 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcRectangleProfileDef>
                     ((Object *)
                      ((long)&(def->super_IfcProfileDef).
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                              _vptr_ObjectHelper +
                      (long)(def->super_IfcProfileDef).
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                            _vptr_ObjectHelper[-3]));
  if (pIVar6 == (IfcRectangleProfileDef *)0x0) {
    pIVar7 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcCircleProfileDef>
                       ((Object *)
                        ((long)&(def->super_IfcProfileDef).
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                                _vptr_ObjectHelper +
                        (long)(def->super_IfcProfileDef).
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                              _vptr_ObjectHelper[-3]));
    this = (Object *)
           ((long)&(def->super_IfcProfileDef).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                   _vptr_ObjectHelper +
           (long)(def->super_IfcProfileDef).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                 [-3]);
    if (pIVar7 == (IfcCircleProfileDef *)0x0) {
      pIVar8 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcIShapeProfileDef>(this);
      if (pIVar8 == (IfcIShapeProfileDef *)0x0) {
        STEP::Object::GetClassName_abi_cxx11_
                  (&local_1c8,
                   (Object *)
                   ((long)&(def->super_IfcProfileDef).
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                           _vptr_ObjectHelper +
                   (long)(def->super_IfcProfileDef).
                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                         _vptr_ObjectHelper[-3]));
        std::operator+(&local_1e8,"skipping unknown IfcParameterizedProfileDef entity, type is ",
                       &local_1c8);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&trafo,
                   &local_1e8);
        LogFunctions<Assimp::IFCImporter>::LogWarn((format *)&trafo);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&trafo);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1c8);
        return;
      }
      dVar2 = (*(double *)&(pIVar8->super_IfcParameterizedProfileDef).field_0x80 -
              pIVar8->WebThickness) * 0.5;
      dVar5 = pIVar8->OverallDepth - (pIVar8->FlangeThickness + pIVar8->FlangeThickness);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&meshout->mVerts,0xc);
      trafo._0_16_ = ZEXT816(0);
      trafo.a3 = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      trafo.a2 = pIVar8->FlangeThickness;
      trafo.a1 = 0.0;
      trafo.a3 = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      trafo.a2 = pIVar8->FlangeThickness;
      trafo.a3 = 0.0;
      trafo.a1 = dVar2;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      trafo.a2 = pIVar8->FlangeThickness + dVar5;
      trafo.a3 = 0.0;
      trafo.a1 = dVar2;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      trafo.a2 = pIVar8->FlangeThickness + dVar5;
      trafo.a1 = 0.0;
      trafo.a3 = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      trafo.a2 = pIVar8->OverallDepth;
      trafo.a1 = 0.0;
      trafo.a3 = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      trafo.a1 = *(double *)&(pIVar8->super_IfcParameterizedProfileDef).field_0x80;
      trafo.a2 = pIVar8->OverallDepth;
      trafo.a3 = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      trafo.a2 = pIVar8->FlangeThickness + dVar5;
      trafo.a1 = *(double *)&(pIVar8->super_IfcParameterizedProfileDef).field_0x80;
      trafo.a3 = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      dVar5 = dVar5 + pIVar8->FlangeThickness;
      trafo.a2._0_4_ = SUB84(dVar5,0);
      trafo.a1 = dVar2 + pIVar8->WebThickness;
      trafo.a2._4_4_ = (int)((ulong)dVar5 >> 0x20);
      trafo.a3 = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      trafo.a1 = dVar2 + pIVar8->WebThickness;
      trafo.a2 = pIVar8->FlangeThickness;
      trafo.a3 = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      trafo.a1 = *(double *)&(pIVar8->super_IfcParameterizedProfileDef).field_0x80;
      trafo.a2 = pIVar8->FlangeThickness;
      trafo.a3 = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      trafo.a2 = 0.0;
      trafo.a1 = (double)*(ulong *)&(pIVar8->super_IfcParameterizedProfileDef).field_0x80;
      trafo.a3 = 0.0;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                 (aiVector3t<double> *)&trafo);
      trafo.a1._0_4_ = 0xc;
    }
    else {
      STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcCircleHollowProfileDef>(this);
      uVar12 = conv->settings->cylindricalTessellation;
      __n = (ulong)(int)uVar12;
      if ((long)__n < 0) {
        fVar10 = (float)((ulong)(uVar12 & 1) | __n >> 1);
        fVar10 = fVar10 + fVar10;
      }
      else {
        fVar10 = (float)(int)uVar12;
      }
      dVar2 = *(double *)&(pIVar7->super_IfcParameterizedProfileDef).field_0x80;
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&meshout->mVerts,__n);
      dVar5 = 0.0;
      while (bVar9 = __n != 0, __n = __n - 1, bVar9) {
        dVar3 = cos(dVar5);
        dVar4 = ::sin(dVar5);
        dVar4 = dVar4 * dVar2;
        trafo.a2._0_4_ = SUB84(dVar4,0);
        trafo.a1 = dVar3 * dVar2;
        trafo.a2._4_4_ = (int)((ulong)dVar4 >> 0x20);
        trafo.a3 = 0.0;
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        emplace_back<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                   (aiVector3t<double> *)&trafo);
        dVar5 = dVar5 + (double)(6.2831855 / fVar10);
      }
      trafo.a1._0_4_ = uVar12;
    }
  }
  else {
    dVar2 = *(double *)&(pIVar6->super_IfcParameterizedProfileDef).field_0x80 * 0.5;
    dVar5 = pIVar6->YDim * 0.5;
    uVar11 = SUB84(dVar5,0);
    uVar12 = (uint)((ulong)dVar5 >> 0x20);
    auVar1._8_4_ = uVar11;
    auVar1._0_8_ = dVar2;
    auVar1._12_4_ = uVar12;
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&meshout->mVerts,
               ((long)(meshout->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(meshout->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18 + 4);
    dStack_220 = auVar1._8_8_;
    trafo.a2 = dStack_220;
    trafo.a1 = dVar2;
    trafo.a3 = 0.0;
    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
    emplace_back<aiVector3t<double>>
              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
               (aiVector3t<double> *)&trafo);
    trafo.a3 = 0.0;
    local_218 = -dVar2;
    uStack_210._0_4_ = uVar11;
    uStack_210._4_4_ = uVar12 ^ 0x80000000;
    trafo.a1 = -dVar2;
    trafo.a2._0_4_ = uVar11;
    trafo.a2._4_4_ = uVar12;
    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
    emplace_back<aiVector3t<double>>
              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
               (aiVector3t<double> *)&trafo);
    trafo.a2 = uStack_210;
    trafo.a1 = local_218;
    trafo.a3 = 0.0;
    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
    emplace_back<aiVector3t<double>>
              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
               (aiVector3t<double> *)&trafo);
    trafo.a1 = dVar2;
    trafo.a2._4_4_ = uVar12 ^ 0x80000000;
    trafo.a3 = 0.0;
    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
    emplace_back<aiVector3t<double>>
              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
               (aiVector3t<double> *)&trafo);
    trafo.a1._0_4_ = 4;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&meshout->mVertcnt,(uint *)&trafo);
  trafo._0_16_ = ZEXT816(0x3ff0000000000000);
  trafo.a3 = 0.0;
  trafo.a4 = 0.0;
  trafo.b1 = 0.0;
  trafo.b2 = 1.0;
  trafo.b3 = 0.0;
  trafo.b4 = 0.0;
  trafo.c1 = 0.0;
  trafo.c2 = 0.0;
  trafo.c3 = 1.0;
  trafo.c4 = 0.0;
  trafo.d1 = 0.0;
  trafo.d2 = 0.0;
  trafo.d3 = 0.0;
  trafo.d4 = 1.0;
  in = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement2D>::operator*
                 ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement2D> *)
                  &(def->super_IfcProfileDef).field_0x68);
  ConvertAxisPlacement(&trafo,in);
  TempMesh::Transform(meshout,&trafo);
  return;
}

Assistant:

void ProcessParametrizedProfile(const Schema_2x3::IfcParameterizedProfileDef& def, TempMesh& meshout, ConversionData& conv)
{
    if(const Schema_2x3::IfcRectangleProfileDef* const cprofile = def.ToPtr<Schema_2x3::IfcRectangleProfileDef>()) {
        const IfcFloat x = cprofile->XDim*0.5f, y = cprofile->YDim*0.5f;

        meshout.mVerts.reserve(meshout.mVerts.size()+4);
        meshout.mVerts.push_back( IfcVector3( x, y, 0.f ));
        meshout.mVerts.push_back( IfcVector3(-x, y, 0.f ));
        meshout.mVerts.push_back( IfcVector3(-x,-y, 0.f ));
        meshout.mVerts.push_back( IfcVector3( x,-y, 0.f ));
        meshout.mVertcnt.push_back(4);
    }
    else if( const Schema_2x3::IfcCircleProfileDef* const circle = def.ToPtr<Schema_2x3::IfcCircleProfileDef>()) {
        if(def.ToPtr<Schema_2x3::IfcCircleHollowProfileDef>()) {
            // TODO
        }
        const size_t segments = conv.settings.cylindricalTessellation;
        const IfcFloat delta = AI_MATH_TWO_PI_F/segments, radius = circle->Radius;

        meshout.mVerts.reserve(segments);

        IfcFloat angle = 0.f;
        for(size_t i = 0; i < segments; ++i, angle += delta) {
            meshout.mVerts.push_back( IfcVector3( std::cos(angle)*radius, std::sin(angle)*radius, 0.f ));
        }

        meshout.mVertcnt.push_back(static_cast<unsigned int>(segments));
    }
    else if( const Schema_2x3::IfcIShapeProfileDef* const ishape = def.ToPtr<Schema_2x3::IfcIShapeProfileDef>()) {
        // construct simplified IBeam shape
        const IfcFloat offset = (ishape->OverallWidth - ishape->WebThickness) / 2;
        const IfcFloat inner_height = ishape->OverallDepth - ishape->FlangeThickness * 2;

        meshout.mVerts.reserve(12);
        meshout.mVerts.push_back(IfcVector3(0,0,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(offset,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(offset,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->OverallDepth,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->OverallDepth,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(offset+ishape->WebThickness,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(offset+ishape->WebThickness,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,0,0));

        meshout.mVertcnt.push_back(12);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcParameterizedProfileDef entity, type is " + def.GetClassName());
        return;
    }

    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, *def.Position);
    meshout.Transform(trafo);
}